

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalks
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,PolylineBuilder *this)

{
  int v_00;
  int iVar1;
  int e_00;
  Graph *this_00;
  bool bVar2;
  reference piVar3;
  mapped_type *pmVar4;
  reference this_01;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  Edge *pEVar8;
  ostream *poVar9;
  reference rVar10;
  S2LogMessage local_128;
  S2LogMessageVoidify local_111;
  undefined1 local_110 [8];
  EdgePolyline polyline_1;
  int local_e0;
  EdgeId e2;
  int j;
  int excess_1;
  InputEdgeId id;
  VertexId v_1;
  _Bit_type local_c8;
  int local_c0;
  int local_bc;
  EdgeId e_1;
  int i;
  EdgePolyline *polyline;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  int local_80;
  VertexId local_7c;
  int excess;
  VertexId v;
  _Bit_type local_70;
  int local_64;
  iterator iStack_60;
  EdgeId e;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> edges;
  PolylineBuilder *this_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *polylines;
  
  edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  GetInputEdgeOrder((vector<int,_std::allocator<int>_> *)local_38,this->g_,&this->min_input_ids_);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_38);
  iStack_60 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_64 = *piVar3;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)local_64);
    _excess = rVar10;
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&excess);
    if (!bVar2) {
      pEVar8 = Graph::edge(this->g_,local_64);
      local_7c = pEVar8->first;
      local_80 = excess_degree(this,local_7c);
      if (0 < local_80) {
        pmVar4 = gtl::internal_btree::
                 btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 ::operator[](&(this->excess_used_).
                               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                              ,&local_7c);
        local_80 = local_80 - *pmVar4;
        if ((this->directed_ & 1U) == 0) {
          if (local_80 % 2 != 0) goto LAB_0040fe5a;
        }
        else if (0 < local_80) {
LAB_0040fe5a:
          pmVar4 = gtl::internal_btree::
                   btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   ::operator[](&(this->excess_used_).
                                 super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                ,&local_7c);
          *pmVar4 = *pmVar4 + 1;
          BuildWalk((EdgePolyline *)&__range2,this,local_7c);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&__range2);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)&__range2);
          this_00 = this->g_;
          this_01 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::back(__return_storage_ptr__);
          pvVar7 = std::vector<int,_std::allocator<int>_>::back(this_01);
          pEVar8 = Graph::edge(this_00,*pvVar7);
          pmVar4 = gtl::internal_btree::
                   btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   ::operator[](&(this->excess_used_).
                                 super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                ,&pEVar8->second);
          *pmVar4 = *pmVar4 + -1;
        }
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  if (0 < this->edges_left_) {
    __end2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin(__return_storage_ptr__);
    polyline = (EdgePolyline *)
               std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::end(__return_storage_ptr__);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)&polyline);
      if (!bVar2) break;
      _e_1 = __gnu_cxx::
             __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator*(&__end2);
      MaximizeWalk(this,_e_1);
      __gnu_cxx::
      __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  local_bc = 0;
  do {
    uVar5 = (ulong)local_bc;
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_38);
    bVar2 = false;
    if (uVar5 < sVar6) {
      bVar2 = 0 < this->edges_left_;
    }
    if (!bVar2) {
      if (this->edges_left_ != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                   ,0x30b,kFatal,(ostream *)&std::cerr);
        poVar9 = S2LogMessage::stream(&local_128);
        poVar9 = std::operator<<(poVar9,"Check failed: (0) == (edges_left_) ");
        S2LogMessageVoidify::operator&(&local_111,poVar9);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_128);
      }
      CanonicalizeVectorOrder(&this->min_input_ids_,__return_storage_ptr__);
      edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = 1;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
      ;
      if ((edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._7_1_ & 1) == 0) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_bc);
    local_c0 = *pvVar7;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)local_c0);
    _id = rVar10;
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&id);
    if (!bVar2) {
      pEVar8 = Graph::edge(this->g_,local_c0);
      v_00 = pEVar8->first;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->min_input_ids_,(long)local_c0);
      iVar1 = *pvVar7;
      e2 = 0;
      local_e0 = local_bc;
      while( true ) {
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_38);
        bVar2 = false;
        if ((ulong)(long)local_e0 < sVar6) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_38,(long)local_e0);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->min_input_ids_,(long)*pvVar7);
          bVar2 = *pvVar7 == iVar1;
        }
        if (!bVar2) break;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_38,(long)local_e0);
        e_00 = *pvVar7;
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)e_00);
        polyline_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)rVar10._M_p;
        bVar2 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)
                           &polyline_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) {
          pEVar8 = Graph::edge(this->g_,e_00);
          if (pEVar8->first == v_00) {
            e2 = e2 + 1;
          }
          pEVar8 = Graph::edge(this->g_,e_00);
          if (pEVar8->second == v_00) {
            e2 = e2 + -1;
          }
        }
        local_e0 = local_e0 + 1;
      }
      if (e2 != 1) {
        pEVar8 = Graph::edge(this->g_,local_c0);
        if (pEVar8->second != v_00) goto LAB_00410365;
      }
      BuildWalk((EdgePolyline *)local_110,this,v_00);
      MaximizeWalk(this,(EdgePolyline *)local_110);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_110);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_110);
    }
LAB_00410365:
    local_bc = local_bc + 1;
  } while( true );
}

Assistant:

vector<Graph::EdgePolyline> Graph::PolylineBuilder::BuildWalks() {
  // Note that some of this code is worst-case quadratic in the maximum vertex
  // degree.  This could be fixed with a few extra arrays, but it should not
  // be a problem in practice.

  // First, build polylines from all vertices where outdegree > indegree (or
  // for undirected edges, vertices whose degree is odd).  We consider the
  // possible starting edges in input edge id order, for idempotency in the
  // case where multiple input polylines share vertices or edges.
  vector<EdgePolyline> polylines;
  vector<EdgeId> edges = g_.GetInputEdgeOrder(min_input_ids_);
  for (EdgeId e : edges) {
    if (used_[e]) continue;
    VertexId v = g_.edge(e).first;
    int excess = excess_degree(v);
    if (excess <= 0) continue;
    excess -= excess_used_[v];
    if (directed_ ? (excess <= 0) : (excess % 2 == 0)) continue;
    ++excess_used_[v];
    polylines.push_back(BuildWalk(v));
    --excess_used_[g_.edge(polylines.back().back()).second];
  }
  // Now all vertices have outdegree == indegree (or even degree if undirected
  // edges are being used).  Therefore all remaining edges can be assembled
  // into loops.  We first try to expand the existing polylines if possible by
  // adding loops to them.
  if (edges_left_ > 0) {
    for (EdgePolyline& polyline : polylines) {
      MaximizeWalk(&polyline);
    }
  }
  // Finally, if there are still unused edges then we build loops.  If the
  // input is a polyline that forms a loop, then for idempotency we need to
  // start from the edge with minimum input edge id.  If the minimal input
  // edge was split into several edges, then we start from the first edge of
  // the chain.
  for (int i = 0; i < edges.size() && edges_left_ > 0; ++i) {
    EdgeId e = edges[i];
    if (used_[e]) continue;

    // Determine whether the origin of this edge is the start of an edge
    // chain.  To do this, we test whether (outdegree - indegree == 1) for the
    // origin, considering only unused edges with the same minimum input edge
    // id.  (Undirected edges have input edge ids in one direction only.)
    VertexId v = g_.edge(e).first;
    InputEdgeId id = min_input_ids_[e];
    int excess = 0;
    for (int j = i; j < edges.size() && min_input_ids_[edges[j]] == id; ++j) {
      EdgeId e2 = edges[j];
      if (used_[e2]) continue;
      if (g_.edge(e2).first == v) ++excess;
      if (g_.edge(e2).second == v) --excess;
    }
    // It is also acceptable to start a polyline from any degenerate edge.
    if (excess == 1 || g_.edge(e).second == v) {
      EdgePolyline polyline = BuildWalk(v);
      MaximizeWalk(&polyline);
      polylines.push_back(std::move(polyline));
    }
  }
  S2_DCHECK_EQ(0, edges_left_);

  // Sort the polylines to correspond to the input order (if possible).
  CanonicalizeVectorOrder(min_input_ids_, &polylines);
  return polylines;
}